

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_append_spell_clause
               (textblock *tb,bitflag *f,_Bool know_hp,monster_race *race,char *conjunction,
               char *end)

{
  monster_spell_level *pmVar1;
  player_state_conflict state;
  player_state_conflict state_00;
  player_state_conflict state_01;
  player_state_conflict state_02;
  player_state_conflict state_03;
  player *p;
  _Bool _Var2;
  int iVar3;
  wchar_t index;
  uint uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  monster_spell *pmVar8;
  monster_spell_level *pmVar9;
  char *pcVar10;
  long lVar11;
  uint8_t attr;
  effect *peVar12;
  bitflag *flags;
  undefined8 *puVar13;
  undefined8 *puVar14;
  byte bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined1 in_stack_fffffffffffffd38 [312];
  undefined8 local_170 [39];
  undefined4 local_38;
  
  bVar15 = 0;
  iVar3 = flag_count(f,0xd);
  if (iVar3 == 0) {
    return;
  }
  index = flag_next(f,0xd,1);
  p = player;
  do {
    player = p;
    if (index == L'\0') {
      textblock_append(tb,"%s","");
      return;
    }
    pmVar8 = monster_spell_by_index(index);
    if (pmVar8 == (monster_spell *)0x0) {
      attr = '\0';
    }
    else {
      peVar12 = pmVar8->effect;
      pmVar1 = pmVar8->level;
      do {
        pmVar9 = pmVar1;
        pmVar1 = pmVar9->next;
        if (pmVar1 == (monster_spell_level *)0x0) break;
      } while (pmVar1->power <= race->spell_power);
      if ((pmVar9->lore_attr_resist != '\0') || (pmVar9->lore_attr_immune != '\0')) {
        if (pmVar9->save_message == (char *)0x0) {
          uVar4 = peVar12->index - 0x4c;
          if ((uVar4 < 0xe) && ((0x2005U >> (uVar4 & 0x1f) & 1) != 0)) {
            wVar5 = peVar12->subtype;
            if (0x13 < (uint)wVar5) {
LAB_0017a0c3:
              memcpy(local_170,&p->known_state,0x13c);
              puVar13 = local_170;
              puVar14 = (undefined8 *)&stack0xfffffffffffffd38;
              for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
                *puVar14 = *puVar13;
                puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
                puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
              }
              state_01.el_info[0x1b].flags = (undefined1)local_38;
              state_01.el_info[0x1b]._3_1_ = local_38._1_1_;
              state_01._314_2_ = local_38._2_2_;
              uVar16 = in_stack_fffffffffffffd38._202_4_;
              uVar17 = in_stack_fffffffffffffd38._206_4_;
              uVar18 = in_stack_fffffffffffffd38._210_4_;
              uVar19 = in_stack_fffffffffffffd38._214_4_;
              uVar20 = in_stack_fffffffffffffd38._218_4_;
              uVar21 = in_stack_fffffffffffffd38._222_4_;
              uVar22 = in_stack_fffffffffffffd38._226_4_;
              uVar23 = in_stack_fffffffffffffd38._230_4_;
              uVar24 = in_stack_fffffffffffffd38._234_4_;
              uVar25 = in_stack_fffffffffffffd38._238_4_;
              uVar26 = in_stack_fffffffffffffd38._242_4_;
              uVar27 = in_stack_fffffffffffffd38._246_4_;
              uVar28 = in_stack_fffffffffffffd38._250_4_;
              uVar29 = in_stack_fffffffffffffd38._254_4_;
              uVar30 = in_stack_fffffffffffffd38._258_4_;
              uVar31 = in_stack_fffffffffffffd38._262_4_;
              uVar32 = in_stack_fffffffffffffd38._266_4_;
              uVar33 = in_stack_fffffffffffffd38._270_4_;
              uVar34 = in_stack_fffffffffffffd38._274_4_;
              uVar35 = in_stack_fffffffffffffd38._278_4_;
              uVar36 = in_stack_fffffffffffffd38._282_4_;
              uVar37 = in_stack_fffffffffffffd38._286_4_;
              uVar38 = in_stack_fffffffffffffd38._290_4_;
              uVar39 = in_stack_fffffffffffffd38._294_4_;
              uVar40 = in_stack_fffffffffffffd38._298_4_;
              uVar41 = in_stack_fffffffffffffd38._302_4_;
              uVar42 = in_stack_fffffffffffffd38._306_4_;
              state_01.stat_add[0] = in_stack_fffffffffffffd38._0_4_;
              state_01.stat_add[1] = in_stack_fffffffffffffd38._4_4_;
              state_01.stat_add[2] = in_stack_fffffffffffffd38._8_4_;
              state_01.stat_add[3] = in_stack_fffffffffffffd38._12_4_;
              state_01.stat_add[4] = in_stack_fffffffffffffd38._16_4_;
              state_01.stat_ind[0] = in_stack_fffffffffffffd38._20_4_;
              state_01.stat_ind[1] = in_stack_fffffffffffffd38._24_4_;
              state_01.stat_ind[2] = in_stack_fffffffffffffd38._28_4_;
              state_01.stat_ind[3] = in_stack_fffffffffffffd38._32_4_;
              state_01.stat_ind[4] = in_stack_fffffffffffffd38._36_4_;
              state_01.stat_use[0] = in_stack_fffffffffffffd38._40_4_;
              state_01.stat_use[1] = in_stack_fffffffffffffd38._44_4_;
              state_01.stat_use[2] = in_stack_fffffffffffffd38._48_4_;
              state_01.stat_use[3] = in_stack_fffffffffffffd38._52_4_;
              state_01.stat_use[4] = in_stack_fffffffffffffd38._56_4_;
              state_01.stat_top[0] = in_stack_fffffffffffffd38._60_4_;
              state_01.stat_top[1] = in_stack_fffffffffffffd38._64_4_;
              state_01.stat_top[2] = in_stack_fffffffffffffd38._68_4_;
              state_01.stat_top[3] = in_stack_fffffffffffffd38._72_4_;
              state_01.stat_top[4] = in_stack_fffffffffffffd38._76_4_;
              state_01.skills[0] = in_stack_fffffffffffffd38._80_4_;
              state_01.skills[1] = in_stack_fffffffffffffd38._84_4_;
              state_01.skills[2] = in_stack_fffffffffffffd38._88_4_;
              state_01.skills[3] = in_stack_fffffffffffffd38._92_4_;
              state_01.skills[4] = in_stack_fffffffffffffd38._96_4_;
              state_01.skills[5] = in_stack_fffffffffffffd38._100_4_;
              state_01.skills[6] = in_stack_fffffffffffffd38._104_4_;
              state_01.skills[7] = in_stack_fffffffffffffd38._108_4_;
              state_01.skills[8] = in_stack_fffffffffffffd38._112_4_;
              state_01.skills[9] = in_stack_fffffffffffffd38._116_4_;
              state_01.speed = in_stack_fffffffffffffd38._120_4_;
              state_01.num_blows = in_stack_fffffffffffffd38._124_4_;
              state_01.num_shots = in_stack_fffffffffffffd38._128_4_;
              state_01.num_moves = in_stack_fffffffffffffd38._132_4_;
              state_01.ammo_mult = in_stack_fffffffffffffd38._136_4_;
              state_01.ammo_tval = in_stack_fffffffffffffd38._140_4_;
              state_01.ac = in_stack_fffffffffffffd38._144_4_;
              state_01.dam_red = in_stack_fffffffffffffd38._148_4_;
              state_01.perc_dam_red = in_stack_fffffffffffffd38._152_4_;
              state_01.to_a = in_stack_fffffffffffffd38._156_4_;
              state_01.to_h = in_stack_fffffffffffffd38._160_4_;
              state_01.to_d = in_stack_fffffffffffffd38._164_4_;
              state_01.see_infra = in_stack_fffffffffffffd38._168_4_;
              state_01.cur_light = in_stack_fffffffffffffd38._172_4_;
              state_01.evasion_chance = in_stack_fffffffffffffd38._176_4_;
              state_01.shield_on_back = (_Bool)in_stack_fffffffffffffd38[0xb4];
              state_01.heavy_wield = (_Bool)in_stack_fffffffffffffd38[0xb5];
              state_01.heavy_shoot = (_Bool)in_stack_fffffffffffffd38[0xb6];
              state_01.bless_wield = (_Bool)in_stack_fffffffffffffd38[0xb7];
              state_01.cumber_armor = (_Bool)in_stack_fffffffffffffd38[0xb8];
              state_01.flags[0] = in_stack_fffffffffffffd38[0xb9];
              state_01.flags[1] = in_stack_fffffffffffffd38[0xba];
              state_01.flags[2] = in_stack_fffffffffffffd38[0xbb];
              state_01.flags[3] = in_stack_fffffffffffffd38[0xbc];
              state_01.flags[4] = in_stack_fffffffffffffd38[0xbd];
              state_01.flags[5] = in_stack_fffffffffffffd38[0xbe];
              state_01.pflags[0] = in_stack_fffffffffffffd38[0xbf];
              state_01.pflags[1] = in_stack_fffffffffffffd38[0xc0];
              state_01.pflags[2] = in_stack_fffffffffffffd38[0xc1];
              state_01.pflags[3] = in_stack_fffffffffffffd38[0xc2];
              state_01.pflags[4] = in_stack_fffffffffffffd38[0xc3];
              state_01.pflags[5] = in_stack_fffffffffffffd38[0xc4];
              state_01.pflags[6] = in_stack_fffffffffffffd38[0xc5];
              state_01.pflags[7] = in_stack_fffffffffffffd38[0xc6];
              state_01.pflags[8] = in_stack_fffffffffffffd38[199];
              state_01.pflags[9] = in_stack_fffffffffffffd38[200];
              state_01._201_1_ = in_stack_fffffffffffffd38[0xc9];
              state_01.el_info[0].res_level = (short)uVar16;
              state_01.el_info[0].flags = (char)((uint)uVar16 >> 0x10);
              state_01.el_info[0]._3_1_ = (char)((uint)uVar16 >> 0x18);
              state_01.el_info[1].res_level = (short)uVar17;
              state_01.el_info[1].flags = (char)((uint)uVar17 >> 0x10);
              state_01.el_info[1]._3_1_ = (char)((uint)uVar17 >> 0x18);
              state_01.el_info[2].res_level = (short)uVar18;
              state_01.el_info[2].flags = (char)((uint)uVar18 >> 0x10);
              state_01.el_info[2]._3_1_ = (char)((uint)uVar18 >> 0x18);
              state_01.el_info[3].res_level = (short)uVar19;
              state_01.el_info[3].flags = (char)((uint)uVar19 >> 0x10);
              state_01.el_info[3]._3_1_ = (char)((uint)uVar19 >> 0x18);
              state_01.el_info[4].res_level = (short)uVar20;
              state_01.el_info[4].flags = (char)((uint)uVar20 >> 0x10);
              state_01.el_info[4]._3_1_ = (char)((uint)uVar20 >> 0x18);
              state_01.el_info[5].res_level = (short)uVar21;
              state_01.el_info[5].flags = (char)((uint)uVar21 >> 0x10);
              state_01.el_info[5]._3_1_ = (char)((uint)uVar21 >> 0x18);
              state_01.el_info[6].res_level = (short)uVar22;
              state_01.el_info[6].flags = (char)((uint)uVar22 >> 0x10);
              state_01.el_info[6]._3_1_ = (char)((uint)uVar22 >> 0x18);
              state_01.el_info[7].res_level = (short)uVar23;
              state_01.el_info[7].flags = (char)((uint)uVar23 >> 0x10);
              state_01.el_info[7]._3_1_ = (char)((uint)uVar23 >> 0x18);
              state_01.el_info[8].res_level = (short)uVar24;
              state_01.el_info[8].flags = (char)((uint)uVar24 >> 0x10);
              state_01.el_info[8]._3_1_ = (char)((uint)uVar24 >> 0x18);
              state_01.el_info[9].res_level = (short)uVar25;
              state_01.el_info[9].flags = (char)((uint)uVar25 >> 0x10);
              state_01.el_info[9]._3_1_ = (char)((uint)uVar25 >> 0x18);
              state_01.el_info[10].res_level = (short)uVar26;
              state_01.el_info[10].flags = (char)((uint)uVar26 >> 0x10);
              state_01.el_info[10]._3_1_ = (char)((uint)uVar26 >> 0x18);
              state_01.el_info[0xb].res_level = (short)uVar27;
              state_01.el_info[0xb].flags = (char)((uint)uVar27 >> 0x10);
              state_01.el_info[0xb]._3_1_ = (char)((uint)uVar27 >> 0x18);
              state_01.el_info[0xc].res_level = (short)uVar28;
              state_01.el_info[0xc].flags = (char)((uint)uVar28 >> 0x10);
              state_01.el_info[0xc]._3_1_ = (char)((uint)uVar28 >> 0x18);
              state_01.el_info[0xd].res_level = (short)uVar29;
              state_01.el_info[0xd].flags = (char)((uint)uVar29 >> 0x10);
              state_01.el_info[0xd]._3_1_ = (char)((uint)uVar29 >> 0x18);
              state_01.el_info[0xe].res_level = (short)uVar30;
              state_01.el_info[0xe].flags = (char)((uint)uVar30 >> 0x10);
              state_01.el_info[0xe]._3_1_ = (char)((uint)uVar30 >> 0x18);
              state_01.el_info[0xf].res_level = (short)uVar31;
              state_01.el_info[0xf].flags = (char)((uint)uVar31 >> 0x10);
              state_01.el_info[0xf]._3_1_ = (char)((uint)uVar31 >> 0x18);
              state_01.el_info[0x10].res_level = (short)uVar32;
              state_01.el_info[0x10].flags = (char)((uint)uVar32 >> 0x10);
              state_01.el_info[0x10]._3_1_ = (char)((uint)uVar32 >> 0x18);
              state_01.el_info[0x11].res_level = (short)uVar33;
              state_01.el_info[0x11].flags = (char)((uint)uVar33 >> 0x10);
              state_01.el_info[0x11]._3_1_ = (char)((uint)uVar33 >> 0x18);
              state_01.el_info[0x12].res_level = (short)uVar34;
              state_01.el_info[0x12].flags = (char)((uint)uVar34 >> 0x10);
              state_01.el_info[0x12]._3_1_ = (char)((uint)uVar34 >> 0x18);
              state_01.el_info[0x13].res_level = (short)uVar35;
              state_01.el_info[0x13].flags = (char)((uint)uVar35 >> 0x10);
              state_01.el_info[0x13]._3_1_ = (char)((uint)uVar35 >> 0x18);
              state_01.el_info[0x14].res_level = (short)uVar36;
              state_01.el_info[0x14].flags = (char)((uint)uVar36 >> 0x10);
              state_01.el_info[0x14]._3_1_ = (char)((uint)uVar36 >> 0x18);
              state_01.el_info[0x15].res_level = (short)uVar37;
              state_01.el_info[0x15].flags = (char)((uint)uVar37 >> 0x10);
              state_01.el_info[0x15]._3_1_ = (char)((uint)uVar37 >> 0x18);
              state_01.el_info[0x16].res_level = (short)uVar38;
              state_01.el_info[0x16].flags = (char)((uint)uVar38 >> 0x10);
              state_01.el_info[0x16]._3_1_ = (char)((uint)uVar38 >> 0x18);
              state_01.el_info[0x17].res_level = (short)uVar39;
              state_01.el_info[0x17].flags = (char)((uint)uVar39 >> 0x10);
              state_01.el_info[0x17]._3_1_ = (char)((uint)uVar39 >> 0x18);
              state_01.el_info[0x18].res_level = (short)uVar40;
              state_01.el_info[0x18].flags = (char)((uint)uVar40 >> 0x10);
              state_01.el_info[0x18]._3_1_ = (char)((uint)uVar40 >> 0x18);
              state_01.el_info[0x19].res_level = (short)uVar41;
              state_01.el_info[0x19].flags = (char)((uint)uVar41 >> 0x10);
              state_01.el_info[0x19]._3_1_ = (char)((uint)uVar41 >> 0x18);
              state_01.el_info[0x1a].res_level = (short)uVar42;
              state_01.el_info[0x1a].flags = (char)((uint)uVar42 >> 0x10);
              state_01.el_info[0x1a]._3_1_ = (char)((uint)uVar42 >> 0x18);
              state_01.el_info[0x1b].res_level = in_stack_fffffffffffffd38._310_2_;
              _Var2 = player_is_immune(state_01,wVar5);
              if (_Var2) {
                attr = pmVar9->lore_attr_immune;
                if (pmVar9->lore_attr_immune == '\0') goto LAB_0017a012;
              }
              else {
                wVar5 = peVar12->subtype;
                memcpy(local_170,&p->known_state,0x13c);
                puVar13 = local_170;
                puVar14 = (undefined8 *)&stack0xfffffffffffffd38;
                for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
                  *puVar14 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
                  puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
                }
                state_03.el_info[0x1b].flags = (undefined1)local_38;
                state_03.el_info[0x1b]._3_1_ = local_38._1_1_;
                state_03._314_2_ = local_38._2_2_;
                uVar16 = in_stack_fffffffffffffd38._202_4_;
                uVar17 = in_stack_fffffffffffffd38._206_4_;
                uVar18 = in_stack_fffffffffffffd38._210_4_;
                uVar19 = in_stack_fffffffffffffd38._214_4_;
                uVar20 = in_stack_fffffffffffffd38._218_4_;
                uVar21 = in_stack_fffffffffffffd38._222_4_;
                uVar22 = in_stack_fffffffffffffd38._226_4_;
                uVar23 = in_stack_fffffffffffffd38._230_4_;
                uVar24 = in_stack_fffffffffffffd38._234_4_;
                uVar25 = in_stack_fffffffffffffd38._238_4_;
                uVar26 = in_stack_fffffffffffffd38._242_4_;
                uVar27 = in_stack_fffffffffffffd38._246_4_;
                uVar28 = in_stack_fffffffffffffd38._250_4_;
                uVar29 = in_stack_fffffffffffffd38._254_4_;
                uVar30 = in_stack_fffffffffffffd38._258_4_;
                uVar31 = in_stack_fffffffffffffd38._262_4_;
                uVar32 = in_stack_fffffffffffffd38._266_4_;
                uVar33 = in_stack_fffffffffffffd38._270_4_;
                uVar34 = in_stack_fffffffffffffd38._274_4_;
                uVar35 = in_stack_fffffffffffffd38._278_4_;
                uVar36 = in_stack_fffffffffffffd38._282_4_;
                uVar37 = in_stack_fffffffffffffd38._286_4_;
                uVar38 = in_stack_fffffffffffffd38._290_4_;
                uVar39 = in_stack_fffffffffffffd38._294_4_;
                uVar40 = in_stack_fffffffffffffd38._298_4_;
                uVar41 = in_stack_fffffffffffffd38._302_4_;
                uVar42 = in_stack_fffffffffffffd38._306_4_;
                state_03.stat_add[0] = in_stack_fffffffffffffd38._0_4_;
                state_03.stat_add[1] = in_stack_fffffffffffffd38._4_4_;
                state_03.stat_add[2] = in_stack_fffffffffffffd38._8_4_;
                state_03.stat_add[3] = in_stack_fffffffffffffd38._12_4_;
                state_03.stat_add[4] = in_stack_fffffffffffffd38._16_4_;
                state_03.stat_ind[0] = in_stack_fffffffffffffd38._20_4_;
                state_03.stat_ind[1] = in_stack_fffffffffffffd38._24_4_;
                state_03.stat_ind[2] = in_stack_fffffffffffffd38._28_4_;
                state_03.stat_ind[3] = in_stack_fffffffffffffd38._32_4_;
                state_03.stat_ind[4] = in_stack_fffffffffffffd38._36_4_;
                state_03.stat_use[0] = in_stack_fffffffffffffd38._40_4_;
                state_03.stat_use[1] = in_stack_fffffffffffffd38._44_4_;
                state_03.stat_use[2] = in_stack_fffffffffffffd38._48_4_;
                state_03.stat_use[3] = in_stack_fffffffffffffd38._52_4_;
                state_03.stat_use[4] = in_stack_fffffffffffffd38._56_4_;
                state_03.stat_top[0] = in_stack_fffffffffffffd38._60_4_;
                state_03.stat_top[1] = in_stack_fffffffffffffd38._64_4_;
                state_03.stat_top[2] = in_stack_fffffffffffffd38._68_4_;
                state_03.stat_top[3] = in_stack_fffffffffffffd38._72_4_;
                state_03.stat_top[4] = in_stack_fffffffffffffd38._76_4_;
                state_03.skills[0] = in_stack_fffffffffffffd38._80_4_;
                state_03.skills[1] = in_stack_fffffffffffffd38._84_4_;
                state_03.skills[2] = in_stack_fffffffffffffd38._88_4_;
                state_03.skills[3] = in_stack_fffffffffffffd38._92_4_;
                state_03.skills[4] = in_stack_fffffffffffffd38._96_4_;
                state_03.skills[5] = in_stack_fffffffffffffd38._100_4_;
                state_03.skills[6] = in_stack_fffffffffffffd38._104_4_;
                state_03.skills[7] = in_stack_fffffffffffffd38._108_4_;
                state_03.skills[8] = in_stack_fffffffffffffd38._112_4_;
                state_03.skills[9] = in_stack_fffffffffffffd38._116_4_;
                state_03.speed = in_stack_fffffffffffffd38._120_4_;
                state_03.num_blows = in_stack_fffffffffffffd38._124_4_;
                state_03.num_shots = in_stack_fffffffffffffd38._128_4_;
                state_03.num_moves = in_stack_fffffffffffffd38._132_4_;
                state_03.ammo_mult = in_stack_fffffffffffffd38._136_4_;
                state_03.ammo_tval = in_stack_fffffffffffffd38._140_4_;
                state_03.ac = in_stack_fffffffffffffd38._144_4_;
                state_03.dam_red = in_stack_fffffffffffffd38._148_4_;
                state_03.perc_dam_red = in_stack_fffffffffffffd38._152_4_;
                state_03.to_a = in_stack_fffffffffffffd38._156_4_;
                state_03.to_h = in_stack_fffffffffffffd38._160_4_;
                state_03.to_d = in_stack_fffffffffffffd38._164_4_;
                state_03.see_infra = in_stack_fffffffffffffd38._168_4_;
                state_03.cur_light = in_stack_fffffffffffffd38._172_4_;
                state_03.evasion_chance = in_stack_fffffffffffffd38._176_4_;
                state_03.shield_on_back = (_Bool)in_stack_fffffffffffffd38[0xb4];
                state_03.heavy_wield = (_Bool)in_stack_fffffffffffffd38[0xb5];
                state_03.heavy_shoot = (_Bool)in_stack_fffffffffffffd38[0xb6];
                state_03.bless_wield = (_Bool)in_stack_fffffffffffffd38[0xb7];
                state_03.cumber_armor = (_Bool)in_stack_fffffffffffffd38[0xb8];
                state_03.flags[0] = in_stack_fffffffffffffd38[0xb9];
                state_03.flags[1] = in_stack_fffffffffffffd38[0xba];
                state_03.flags[2] = in_stack_fffffffffffffd38[0xbb];
                state_03.flags[3] = in_stack_fffffffffffffd38[0xbc];
                state_03.flags[4] = in_stack_fffffffffffffd38[0xbd];
                state_03.flags[5] = in_stack_fffffffffffffd38[0xbe];
                state_03.pflags[0] = in_stack_fffffffffffffd38[0xbf];
                state_03.pflags[1] = in_stack_fffffffffffffd38[0xc0];
                state_03.pflags[2] = in_stack_fffffffffffffd38[0xc1];
                state_03.pflags[3] = in_stack_fffffffffffffd38[0xc2];
                state_03.pflags[4] = in_stack_fffffffffffffd38[0xc3];
                state_03.pflags[5] = in_stack_fffffffffffffd38[0xc4];
                state_03.pflags[6] = in_stack_fffffffffffffd38[0xc5];
                state_03.pflags[7] = in_stack_fffffffffffffd38[0xc6];
                state_03.pflags[8] = in_stack_fffffffffffffd38[199];
                state_03.pflags[9] = in_stack_fffffffffffffd38[200];
                state_03._201_1_ = in_stack_fffffffffffffd38[0xc9];
                state_03.el_info[0].res_level = (short)uVar16;
                state_03.el_info[0].flags = (char)((uint)uVar16 >> 0x10);
                state_03.el_info[0]._3_1_ = (char)((uint)uVar16 >> 0x18);
                state_03.el_info[1].res_level = (short)uVar17;
                state_03.el_info[1].flags = (char)((uint)uVar17 >> 0x10);
                state_03.el_info[1]._3_1_ = (char)((uint)uVar17 >> 0x18);
                state_03.el_info[2].res_level = (short)uVar18;
                state_03.el_info[2].flags = (char)((uint)uVar18 >> 0x10);
                state_03.el_info[2]._3_1_ = (char)((uint)uVar18 >> 0x18);
                state_03.el_info[3].res_level = (short)uVar19;
                state_03.el_info[3].flags = (char)((uint)uVar19 >> 0x10);
                state_03.el_info[3]._3_1_ = (char)((uint)uVar19 >> 0x18);
                state_03.el_info[4].res_level = (short)uVar20;
                state_03.el_info[4].flags = (char)((uint)uVar20 >> 0x10);
                state_03.el_info[4]._3_1_ = (char)((uint)uVar20 >> 0x18);
                state_03.el_info[5].res_level = (short)uVar21;
                state_03.el_info[5].flags = (char)((uint)uVar21 >> 0x10);
                state_03.el_info[5]._3_1_ = (char)((uint)uVar21 >> 0x18);
                state_03.el_info[6].res_level = (short)uVar22;
                state_03.el_info[6].flags = (char)((uint)uVar22 >> 0x10);
                state_03.el_info[6]._3_1_ = (char)((uint)uVar22 >> 0x18);
                state_03.el_info[7].res_level = (short)uVar23;
                state_03.el_info[7].flags = (char)((uint)uVar23 >> 0x10);
                state_03.el_info[7]._3_1_ = (char)((uint)uVar23 >> 0x18);
                state_03.el_info[8].res_level = (short)uVar24;
                state_03.el_info[8].flags = (char)((uint)uVar24 >> 0x10);
                state_03.el_info[8]._3_1_ = (char)((uint)uVar24 >> 0x18);
                state_03.el_info[9].res_level = (short)uVar25;
                state_03.el_info[9].flags = (char)((uint)uVar25 >> 0x10);
                state_03.el_info[9]._3_1_ = (char)((uint)uVar25 >> 0x18);
                state_03.el_info[10].res_level = (short)uVar26;
                state_03.el_info[10].flags = (char)((uint)uVar26 >> 0x10);
                state_03.el_info[10]._3_1_ = (char)((uint)uVar26 >> 0x18);
                state_03.el_info[0xb].res_level = (short)uVar27;
                state_03.el_info[0xb].flags = (char)((uint)uVar27 >> 0x10);
                state_03.el_info[0xb]._3_1_ = (char)((uint)uVar27 >> 0x18);
                state_03.el_info[0xc].res_level = (short)uVar28;
                state_03.el_info[0xc].flags = (char)((uint)uVar28 >> 0x10);
                state_03.el_info[0xc]._3_1_ = (char)((uint)uVar28 >> 0x18);
                state_03.el_info[0xd].res_level = (short)uVar29;
                state_03.el_info[0xd].flags = (char)((uint)uVar29 >> 0x10);
                state_03.el_info[0xd]._3_1_ = (char)((uint)uVar29 >> 0x18);
                state_03.el_info[0xe].res_level = (short)uVar30;
                state_03.el_info[0xe].flags = (char)((uint)uVar30 >> 0x10);
                state_03.el_info[0xe]._3_1_ = (char)((uint)uVar30 >> 0x18);
                state_03.el_info[0xf].res_level = (short)uVar31;
                state_03.el_info[0xf].flags = (char)((uint)uVar31 >> 0x10);
                state_03.el_info[0xf]._3_1_ = (char)((uint)uVar31 >> 0x18);
                state_03.el_info[0x10].res_level = (short)uVar32;
                state_03.el_info[0x10].flags = (char)((uint)uVar32 >> 0x10);
                state_03.el_info[0x10]._3_1_ = (char)((uint)uVar32 >> 0x18);
                state_03.el_info[0x11].res_level = (short)uVar33;
                state_03.el_info[0x11].flags = (char)((uint)uVar33 >> 0x10);
                state_03.el_info[0x11]._3_1_ = (char)((uint)uVar33 >> 0x18);
                state_03.el_info[0x12].res_level = (short)uVar34;
                state_03.el_info[0x12].flags = (char)((uint)uVar34 >> 0x10);
                state_03.el_info[0x12]._3_1_ = (char)((uint)uVar34 >> 0x18);
                state_03.el_info[0x13].res_level = (short)uVar35;
                state_03.el_info[0x13].flags = (char)((uint)uVar35 >> 0x10);
                state_03.el_info[0x13]._3_1_ = (char)((uint)uVar35 >> 0x18);
                state_03.el_info[0x14].res_level = (short)uVar36;
                state_03.el_info[0x14].flags = (char)((uint)uVar36 >> 0x10);
                state_03.el_info[0x14]._3_1_ = (char)((uint)uVar36 >> 0x18);
                state_03.el_info[0x15].res_level = (short)uVar37;
                state_03.el_info[0x15].flags = (char)((uint)uVar37 >> 0x10);
                state_03.el_info[0x15]._3_1_ = (char)((uint)uVar37 >> 0x18);
                state_03.el_info[0x16].res_level = (short)uVar38;
                state_03.el_info[0x16].flags = (char)((uint)uVar38 >> 0x10);
                state_03.el_info[0x16]._3_1_ = (char)((uint)uVar38 >> 0x18);
                state_03.el_info[0x17].res_level = (short)uVar39;
                state_03.el_info[0x17].flags = (char)((uint)uVar39 >> 0x10);
                state_03.el_info[0x17]._3_1_ = (char)((uint)uVar39 >> 0x18);
                state_03.el_info[0x18].res_level = (short)uVar40;
                state_03.el_info[0x18].flags = (char)((uint)uVar40 >> 0x10);
                state_03.el_info[0x18]._3_1_ = (char)((uint)uVar40 >> 0x18);
                state_03.el_info[0x19].res_level = (short)uVar41;
                state_03.el_info[0x19].flags = (char)((uint)uVar41 >> 0x10);
                state_03.el_info[0x19]._3_1_ = (char)((uint)uVar41 >> 0x18);
                state_03.el_info[0x1a].res_level = (short)uVar42;
                state_03.el_info[0x1a].flags = (char)((uint)uVar42 >> 0x10);
                state_03.el_info[0x1a]._3_1_ = (char)((uint)uVar42 >> 0x18);
                state_03.el_info[0x1b].res_level = in_stack_fffffffffffffd38._310_2_;
                _Var2 = player_resists_effects(state_03,wVar5);
                if (_Var2) {
                  attr = pmVar9->lore_attr_resist;
                }
                else {
LAB_0017a1bb:
                  attr = pmVar9->lore_attr;
                }
              }
              goto LAB_0017a204;
            }
            if ((0xa6000U >> (wVar5 & 0x1fU) & 1) == 0) {
              if (wVar5 == L'\a') {
                memcpy(local_170,&p->known_state,0x13c);
                puVar13 = local_170;
                puVar14 = (undefined8 *)&stack0xfffffffffffffd38;
                for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
                  *puVar14 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
                  puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
                }
                state_02.el_info[0x1b].flags = (undefined1)local_38;
                state_02.el_info[0x1b]._3_1_ = local_38._1_1_;
                state_02._314_2_ = local_38._2_2_;
                uVar16 = in_stack_fffffffffffffd38._202_4_;
                uVar17 = in_stack_fffffffffffffd38._206_4_;
                uVar18 = in_stack_fffffffffffffd38._210_4_;
                uVar19 = in_stack_fffffffffffffd38._214_4_;
                uVar20 = in_stack_fffffffffffffd38._218_4_;
                uVar21 = in_stack_fffffffffffffd38._222_4_;
                uVar22 = in_stack_fffffffffffffd38._226_4_;
                uVar23 = in_stack_fffffffffffffd38._230_4_;
                uVar24 = in_stack_fffffffffffffd38._234_4_;
                uVar25 = in_stack_fffffffffffffd38._238_4_;
                uVar26 = in_stack_fffffffffffffd38._242_4_;
                uVar27 = in_stack_fffffffffffffd38._246_4_;
                uVar28 = in_stack_fffffffffffffd38._250_4_;
                uVar29 = in_stack_fffffffffffffd38._254_4_;
                uVar30 = in_stack_fffffffffffffd38._258_4_;
                uVar31 = in_stack_fffffffffffffd38._262_4_;
                uVar32 = in_stack_fffffffffffffd38._266_4_;
                uVar33 = in_stack_fffffffffffffd38._270_4_;
                uVar34 = in_stack_fffffffffffffd38._274_4_;
                uVar35 = in_stack_fffffffffffffd38._278_4_;
                uVar36 = in_stack_fffffffffffffd38._282_4_;
                uVar37 = in_stack_fffffffffffffd38._286_4_;
                uVar38 = in_stack_fffffffffffffd38._290_4_;
                uVar39 = in_stack_fffffffffffffd38._294_4_;
                uVar40 = in_stack_fffffffffffffd38._298_4_;
                uVar41 = in_stack_fffffffffffffd38._302_4_;
                uVar42 = in_stack_fffffffffffffd38._306_4_;
                state_02.stat_add[0] = in_stack_fffffffffffffd38._0_4_;
                state_02.stat_add[1] = in_stack_fffffffffffffd38._4_4_;
                state_02.stat_add[2] = in_stack_fffffffffffffd38._8_4_;
                state_02.stat_add[3] = in_stack_fffffffffffffd38._12_4_;
                state_02.stat_add[4] = in_stack_fffffffffffffd38._16_4_;
                state_02.stat_ind[0] = in_stack_fffffffffffffd38._20_4_;
                state_02.stat_ind[1] = in_stack_fffffffffffffd38._24_4_;
                state_02.stat_ind[2] = in_stack_fffffffffffffd38._28_4_;
                state_02.stat_ind[3] = in_stack_fffffffffffffd38._32_4_;
                state_02.stat_ind[4] = in_stack_fffffffffffffd38._36_4_;
                state_02.stat_use[0] = in_stack_fffffffffffffd38._40_4_;
                state_02.stat_use[1] = in_stack_fffffffffffffd38._44_4_;
                state_02.stat_use[2] = in_stack_fffffffffffffd38._48_4_;
                state_02.stat_use[3] = in_stack_fffffffffffffd38._52_4_;
                state_02.stat_use[4] = in_stack_fffffffffffffd38._56_4_;
                state_02.stat_top[0] = in_stack_fffffffffffffd38._60_4_;
                state_02.stat_top[1] = in_stack_fffffffffffffd38._64_4_;
                state_02.stat_top[2] = in_stack_fffffffffffffd38._68_4_;
                state_02.stat_top[3] = in_stack_fffffffffffffd38._72_4_;
                state_02.stat_top[4] = in_stack_fffffffffffffd38._76_4_;
                state_02.skills[0] = in_stack_fffffffffffffd38._80_4_;
                state_02.skills[1] = in_stack_fffffffffffffd38._84_4_;
                state_02.skills[2] = in_stack_fffffffffffffd38._88_4_;
                state_02.skills[3] = in_stack_fffffffffffffd38._92_4_;
                state_02.skills[4] = in_stack_fffffffffffffd38._96_4_;
                state_02.skills[5] = in_stack_fffffffffffffd38._100_4_;
                state_02.skills[6] = in_stack_fffffffffffffd38._104_4_;
                state_02.skills[7] = in_stack_fffffffffffffd38._108_4_;
                state_02.skills[8] = in_stack_fffffffffffffd38._112_4_;
                state_02.skills[9] = in_stack_fffffffffffffd38._116_4_;
                state_02.speed = in_stack_fffffffffffffd38._120_4_;
                state_02.num_blows = in_stack_fffffffffffffd38._124_4_;
                state_02.num_shots = in_stack_fffffffffffffd38._128_4_;
                state_02.num_moves = in_stack_fffffffffffffd38._132_4_;
                state_02.ammo_mult = in_stack_fffffffffffffd38._136_4_;
                state_02.ammo_tval = in_stack_fffffffffffffd38._140_4_;
                state_02.ac = in_stack_fffffffffffffd38._144_4_;
                state_02.dam_red = in_stack_fffffffffffffd38._148_4_;
                state_02.perc_dam_red = in_stack_fffffffffffffd38._152_4_;
                state_02.to_a = in_stack_fffffffffffffd38._156_4_;
                state_02.to_h = in_stack_fffffffffffffd38._160_4_;
                state_02.to_d = in_stack_fffffffffffffd38._164_4_;
                state_02.see_infra = in_stack_fffffffffffffd38._168_4_;
                state_02.cur_light = in_stack_fffffffffffffd38._172_4_;
                state_02.evasion_chance = in_stack_fffffffffffffd38._176_4_;
                state_02.shield_on_back = (_Bool)in_stack_fffffffffffffd38[0xb4];
                state_02.heavy_wield = (_Bool)in_stack_fffffffffffffd38[0xb5];
                state_02.heavy_shoot = (_Bool)in_stack_fffffffffffffd38[0xb6];
                state_02.bless_wield = (_Bool)in_stack_fffffffffffffd38[0xb7];
                state_02.cumber_armor = (_Bool)in_stack_fffffffffffffd38[0xb8];
                state_02.flags[0] = in_stack_fffffffffffffd38[0xb9];
                state_02.flags[1] = in_stack_fffffffffffffd38[0xba];
                state_02.flags[2] = in_stack_fffffffffffffd38[0xbb];
                state_02.flags[3] = in_stack_fffffffffffffd38[0xbc];
                state_02.flags[4] = in_stack_fffffffffffffd38[0xbd];
                state_02.flags[5] = in_stack_fffffffffffffd38[0xbe];
                state_02.pflags[0] = in_stack_fffffffffffffd38[0xbf];
                state_02.pflags[1] = in_stack_fffffffffffffd38[0xc0];
                state_02.pflags[2] = in_stack_fffffffffffffd38[0xc1];
                state_02.pflags[3] = in_stack_fffffffffffffd38[0xc2];
                state_02.pflags[4] = in_stack_fffffffffffffd38[0xc3];
                state_02.pflags[5] = in_stack_fffffffffffffd38[0xc4];
                state_02.pflags[6] = in_stack_fffffffffffffd38[0xc5];
                state_02.pflags[7] = in_stack_fffffffffffffd38[0xc6];
                state_02.pflags[8] = in_stack_fffffffffffffd38[199];
                state_02.pflags[9] = in_stack_fffffffffffffd38[200];
                state_02._201_1_ = in_stack_fffffffffffffd38[0xc9];
                state_02.el_info[0].res_level = (short)uVar16;
                state_02.el_info[0].flags = (char)((uint)uVar16 >> 0x10);
                state_02.el_info[0]._3_1_ = (char)((uint)uVar16 >> 0x18);
                state_02.el_info[1].res_level = (short)uVar17;
                state_02.el_info[1].flags = (char)((uint)uVar17 >> 0x10);
                state_02.el_info[1]._3_1_ = (char)((uint)uVar17 >> 0x18);
                state_02.el_info[2].res_level = (short)uVar18;
                state_02.el_info[2].flags = (char)((uint)uVar18 >> 0x10);
                state_02.el_info[2]._3_1_ = (char)((uint)uVar18 >> 0x18);
                state_02.el_info[3].res_level = (short)uVar19;
                state_02.el_info[3].flags = (char)((uint)uVar19 >> 0x10);
                state_02.el_info[3]._3_1_ = (char)((uint)uVar19 >> 0x18);
                state_02.el_info[4].res_level = (short)uVar20;
                state_02.el_info[4].flags = (char)((uint)uVar20 >> 0x10);
                state_02.el_info[4]._3_1_ = (char)((uint)uVar20 >> 0x18);
                state_02.el_info[5].res_level = (short)uVar21;
                state_02.el_info[5].flags = (char)((uint)uVar21 >> 0x10);
                state_02.el_info[5]._3_1_ = (char)((uint)uVar21 >> 0x18);
                state_02.el_info[6].res_level = (short)uVar22;
                state_02.el_info[6].flags = (char)((uint)uVar22 >> 0x10);
                state_02.el_info[6]._3_1_ = (char)((uint)uVar22 >> 0x18);
                state_02.el_info[7].res_level = (short)uVar23;
                state_02.el_info[7].flags = (char)((uint)uVar23 >> 0x10);
                state_02.el_info[7]._3_1_ = (char)((uint)uVar23 >> 0x18);
                state_02.el_info[8].res_level = (short)uVar24;
                state_02.el_info[8].flags = (char)((uint)uVar24 >> 0x10);
                state_02.el_info[8]._3_1_ = (char)((uint)uVar24 >> 0x18);
                state_02.el_info[9].res_level = (short)uVar25;
                state_02.el_info[9].flags = (char)((uint)uVar25 >> 0x10);
                state_02.el_info[9]._3_1_ = (char)((uint)uVar25 >> 0x18);
                state_02.el_info[10].res_level = (short)uVar26;
                state_02.el_info[10].flags = (char)((uint)uVar26 >> 0x10);
                state_02.el_info[10]._3_1_ = (char)((uint)uVar26 >> 0x18);
                state_02.el_info[0xb].res_level = (short)uVar27;
                state_02.el_info[0xb].flags = (char)((uint)uVar27 >> 0x10);
                state_02.el_info[0xb]._3_1_ = (char)((uint)uVar27 >> 0x18);
                state_02.el_info[0xc].res_level = (short)uVar28;
                state_02.el_info[0xc].flags = (char)((uint)uVar28 >> 0x10);
                state_02.el_info[0xc]._3_1_ = (char)((uint)uVar28 >> 0x18);
                state_02.el_info[0xd].res_level = (short)uVar29;
                state_02.el_info[0xd].flags = (char)((uint)uVar29 >> 0x10);
                state_02.el_info[0xd]._3_1_ = (char)((uint)uVar29 >> 0x18);
                state_02.el_info[0xe].res_level = (short)uVar30;
                state_02.el_info[0xe].flags = (char)((uint)uVar30 >> 0x10);
                state_02.el_info[0xe]._3_1_ = (char)((uint)uVar30 >> 0x18);
                state_02.el_info[0xf].res_level = (short)uVar31;
                state_02.el_info[0xf].flags = (char)((uint)uVar31 >> 0x10);
                state_02.el_info[0xf]._3_1_ = (char)((uint)uVar31 >> 0x18);
                state_02.el_info[0x10].res_level = (short)uVar32;
                state_02.el_info[0x10].flags = (char)((uint)uVar32 >> 0x10);
                state_02.el_info[0x10]._3_1_ = (char)((uint)uVar32 >> 0x18);
                state_02.el_info[0x11].res_level = (short)uVar33;
                state_02.el_info[0x11].flags = (char)((uint)uVar33 >> 0x10);
                state_02.el_info[0x11]._3_1_ = (char)((uint)uVar33 >> 0x18);
                state_02.el_info[0x12].res_level = (short)uVar34;
                state_02.el_info[0x12].flags = (char)((uint)uVar34 >> 0x10);
                state_02.el_info[0x12]._3_1_ = (char)((uint)uVar34 >> 0x18);
                state_02.el_info[0x13].res_level = (short)uVar35;
                state_02.el_info[0x13].flags = (char)((uint)uVar35 >> 0x10);
                state_02.el_info[0x13]._3_1_ = (char)((uint)uVar35 >> 0x18);
                state_02.el_info[0x14].res_level = (short)uVar36;
                state_02.el_info[0x14].flags = (char)((uint)uVar36 >> 0x10);
                state_02.el_info[0x14]._3_1_ = (char)((uint)uVar36 >> 0x18);
                state_02.el_info[0x15].res_level = (short)uVar37;
                state_02.el_info[0x15].flags = (char)((uint)uVar37 >> 0x10);
                state_02.el_info[0x15]._3_1_ = (char)((uint)uVar37 >> 0x18);
                state_02.el_info[0x16].res_level = (short)uVar38;
                state_02.el_info[0x16].flags = (char)((uint)uVar38 >> 0x10);
                state_02.el_info[0x16]._3_1_ = (char)((uint)uVar38 >> 0x18);
                state_02.el_info[0x17].res_level = (short)uVar39;
                state_02.el_info[0x17].flags = (char)((uint)uVar39 >> 0x10);
                state_02.el_info[0x17]._3_1_ = (char)((uint)uVar39 >> 0x18);
                state_02.el_info[0x18].res_level = (short)uVar40;
                state_02.el_info[0x18].flags = (char)((uint)uVar40 >> 0x10);
                state_02.el_info[0x18]._3_1_ = (char)((uint)uVar40 >> 0x18);
                state_02.el_info[0x19].res_level = (short)uVar41;
                state_02.el_info[0x19].flags = (char)((uint)uVar41 >> 0x10);
                state_02.el_info[0x19]._3_1_ = (char)((uint)uVar41 >> 0x18);
                state_02.el_info[0x1a].res_level = (short)uVar42;
                state_02.el_info[0x1a].flags = (char)((uint)uVar42 >> 0x10);
                state_02.el_info[0x1a]._3_1_ = (char)((uint)uVar42 >> 0x18);
                state_02.el_info[0x1b].res_level = in_stack_fffffffffffffd38._310_2_;
                _Var2 = player_resists_effects(state_02,L'\a');
                if (_Var2) {
LAB_0017a16b:
                  attr = pmVar9->lore_attr_immune;
                  goto LAB_0017a204;
                }
                _Var2 = flag_has_dbg((p->known_state).flags,6,9,"p->known_state.flags",
                                     "OF_PROT_STUN");
                if (_Var2) goto LAB_0017a012;
              }
              else {
                if (wVar5 != L'\t') goto LAB_0017a0c3;
                memcpy(local_170,&p->known_state,0x13c);
                puVar13 = local_170;
                puVar14 = (undefined8 *)&stack0xfffffffffffffd38;
                for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
                  *puVar14 = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
                  puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
                }
                state_00.el_info[0x1b].flags = (undefined1)local_38;
                state_00.el_info[0x1b]._3_1_ = local_38._1_1_;
                state_00._314_2_ = local_38._2_2_;
                uVar16 = in_stack_fffffffffffffd38._202_4_;
                uVar17 = in_stack_fffffffffffffd38._206_4_;
                uVar18 = in_stack_fffffffffffffd38._210_4_;
                uVar19 = in_stack_fffffffffffffd38._214_4_;
                uVar20 = in_stack_fffffffffffffd38._218_4_;
                uVar21 = in_stack_fffffffffffffd38._222_4_;
                uVar22 = in_stack_fffffffffffffd38._226_4_;
                uVar23 = in_stack_fffffffffffffd38._230_4_;
                uVar24 = in_stack_fffffffffffffd38._234_4_;
                uVar25 = in_stack_fffffffffffffd38._238_4_;
                uVar26 = in_stack_fffffffffffffd38._242_4_;
                uVar27 = in_stack_fffffffffffffd38._246_4_;
                uVar28 = in_stack_fffffffffffffd38._250_4_;
                uVar29 = in_stack_fffffffffffffd38._254_4_;
                uVar30 = in_stack_fffffffffffffd38._258_4_;
                uVar31 = in_stack_fffffffffffffd38._262_4_;
                uVar32 = in_stack_fffffffffffffd38._266_4_;
                uVar33 = in_stack_fffffffffffffd38._270_4_;
                uVar34 = in_stack_fffffffffffffd38._274_4_;
                uVar35 = in_stack_fffffffffffffd38._278_4_;
                uVar36 = in_stack_fffffffffffffd38._282_4_;
                uVar37 = in_stack_fffffffffffffd38._286_4_;
                uVar38 = in_stack_fffffffffffffd38._290_4_;
                uVar39 = in_stack_fffffffffffffd38._294_4_;
                uVar40 = in_stack_fffffffffffffd38._298_4_;
                uVar41 = in_stack_fffffffffffffd38._302_4_;
                uVar42 = in_stack_fffffffffffffd38._306_4_;
                state_00.stat_add[0] = in_stack_fffffffffffffd38._0_4_;
                state_00.stat_add[1] = in_stack_fffffffffffffd38._4_4_;
                state_00.stat_add[2] = in_stack_fffffffffffffd38._8_4_;
                state_00.stat_add[3] = in_stack_fffffffffffffd38._12_4_;
                state_00.stat_add[4] = in_stack_fffffffffffffd38._16_4_;
                state_00.stat_ind[0] = in_stack_fffffffffffffd38._20_4_;
                state_00.stat_ind[1] = in_stack_fffffffffffffd38._24_4_;
                state_00.stat_ind[2] = in_stack_fffffffffffffd38._28_4_;
                state_00.stat_ind[3] = in_stack_fffffffffffffd38._32_4_;
                state_00.stat_ind[4] = in_stack_fffffffffffffd38._36_4_;
                state_00.stat_use[0] = in_stack_fffffffffffffd38._40_4_;
                state_00.stat_use[1] = in_stack_fffffffffffffd38._44_4_;
                state_00.stat_use[2] = in_stack_fffffffffffffd38._48_4_;
                state_00.stat_use[3] = in_stack_fffffffffffffd38._52_4_;
                state_00.stat_use[4] = in_stack_fffffffffffffd38._56_4_;
                state_00.stat_top[0] = in_stack_fffffffffffffd38._60_4_;
                state_00.stat_top[1] = in_stack_fffffffffffffd38._64_4_;
                state_00.stat_top[2] = in_stack_fffffffffffffd38._68_4_;
                state_00.stat_top[3] = in_stack_fffffffffffffd38._72_4_;
                state_00.stat_top[4] = in_stack_fffffffffffffd38._76_4_;
                state_00.skills[0] = in_stack_fffffffffffffd38._80_4_;
                state_00.skills[1] = in_stack_fffffffffffffd38._84_4_;
                state_00.skills[2] = in_stack_fffffffffffffd38._88_4_;
                state_00.skills[3] = in_stack_fffffffffffffd38._92_4_;
                state_00.skills[4] = in_stack_fffffffffffffd38._96_4_;
                state_00.skills[5] = in_stack_fffffffffffffd38._100_4_;
                state_00.skills[6] = in_stack_fffffffffffffd38._104_4_;
                state_00.skills[7] = in_stack_fffffffffffffd38._108_4_;
                state_00.skills[8] = in_stack_fffffffffffffd38._112_4_;
                state_00.skills[9] = in_stack_fffffffffffffd38._116_4_;
                state_00.speed = in_stack_fffffffffffffd38._120_4_;
                state_00.num_blows = in_stack_fffffffffffffd38._124_4_;
                state_00.num_shots = in_stack_fffffffffffffd38._128_4_;
                state_00.num_moves = in_stack_fffffffffffffd38._132_4_;
                state_00.ammo_mult = in_stack_fffffffffffffd38._136_4_;
                state_00.ammo_tval = in_stack_fffffffffffffd38._140_4_;
                state_00.ac = in_stack_fffffffffffffd38._144_4_;
                state_00.dam_red = in_stack_fffffffffffffd38._148_4_;
                state_00.perc_dam_red = in_stack_fffffffffffffd38._152_4_;
                state_00.to_a = in_stack_fffffffffffffd38._156_4_;
                state_00.to_h = in_stack_fffffffffffffd38._160_4_;
                state_00.to_d = in_stack_fffffffffffffd38._164_4_;
                state_00.see_infra = in_stack_fffffffffffffd38._168_4_;
                state_00.cur_light = in_stack_fffffffffffffd38._172_4_;
                state_00.evasion_chance = in_stack_fffffffffffffd38._176_4_;
                state_00.shield_on_back = (_Bool)in_stack_fffffffffffffd38[0xb4];
                state_00.heavy_wield = (_Bool)in_stack_fffffffffffffd38[0xb5];
                state_00.heavy_shoot = (_Bool)in_stack_fffffffffffffd38[0xb6];
                state_00.bless_wield = (_Bool)in_stack_fffffffffffffd38[0xb7];
                state_00.cumber_armor = (_Bool)in_stack_fffffffffffffd38[0xb8];
                state_00.flags[0] = in_stack_fffffffffffffd38[0xb9];
                state_00.flags[1] = in_stack_fffffffffffffd38[0xba];
                state_00.flags[2] = in_stack_fffffffffffffd38[0xbb];
                state_00.flags[3] = in_stack_fffffffffffffd38[0xbc];
                state_00.flags[4] = in_stack_fffffffffffffd38[0xbd];
                state_00.flags[5] = in_stack_fffffffffffffd38[0xbe];
                state_00.pflags[0] = in_stack_fffffffffffffd38[0xbf];
                state_00.pflags[1] = in_stack_fffffffffffffd38[0xc0];
                state_00.pflags[2] = in_stack_fffffffffffffd38[0xc1];
                state_00.pflags[3] = in_stack_fffffffffffffd38[0xc2];
                state_00.pflags[4] = in_stack_fffffffffffffd38[0xc3];
                state_00.pflags[5] = in_stack_fffffffffffffd38[0xc4];
                state_00.pflags[6] = in_stack_fffffffffffffd38[0xc5];
                state_00.pflags[7] = in_stack_fffffffffffffd38[0xc6];
                state_00.pflags[8] = in_stack_fffffffffffffd38[199];
                state_00.pflags[9] = in_stack_fffffffffffffd38[200];
                state_00._201_1_ = in_stack_fffffffffffffd38[0xc9];
                state_00.el_info[0].res_level = (short)uVar16;
                state_00.el_info[0].flags = (char)((uint)uVar16 >> 0x10);
                state_00.el_info[0]._3_1_ = (char)((uint)uVar16 >> 0x18);
                state_00.el_info[1].res_level = (short)uVar17;
                state_00.el_info[1].flags = (char)((uint)uVar17 >> 0x10);
                state_00.el_info[1]._3_1_ = (char)((uint)uVar17 >> 0x18);
                state_00.el_info[2].res_level = (short)uVar18;
                state_00.el_info[2].flags = (char)((uint)uVar18 >> 0x10);
                state_00.el_info[2]._3_1_ = (char)((uint)uVar18 >> 0x18);
                state_00.el_info[3].res_level = (short)uVar19;
                state_00.el_info[3].flags = (char)((uint)uVar19 >> 0x10);
                state_00.el_info[3]._3_1_ = (char)((uint)uVar19 >> 0x18);
                state_00.el_info[4].res_level = (short)uVar20;
                state_00.el_info[4].flags = (char)((uint)uVar20 >> 0x10);
                state_00.el_info[4]._3_1_ = (char)((uint)uVar20 >> 0x18);
                state_00.el_info[5].res_level = (short)uVar21;
                state_00.el_info[5].flags = (char)((uint)uVar21 >> 0x10);
                state_00.el_info[5]._3_1_ = (char)((uint)uVar21 >> 0x18);
                state_00.el_info[6].res_level = (short)uVar22;
                state_00.el_info[6].flags = (char)((uint)uVar22 >> 0x10);
                state_00.el_info[6]._3_1_ = (char)((uint)uVar22 >> 0x18);
                state_00.el_info[7].res_level = (short)uVar23;
                state_00.el_info[7].flags = (char)((uint)uVar23 >> 0x10);
                state_00.el_info[7]._3_1_ = (char)((uint)uVar23 >> 0x18);
                state_00.el_info[8].res_level = (short)uVar24;
                state_00.el_info[8].flags = (char)((uint)uVar24 >> 0x10);
                state_00.el_info[8]._3_1_ = (char)((uint)uVar24 >> 0x18);
                state_00.el_info[9].res_level = (short)uVar25;
                state_00.el_info[9].flags = (char)((uint)uVar25 >> 0x10);
                state_00.el_info[9]._3_1_ = (char)((uint)uVar25 >> 0x18);
                state_00.el_info[10].res_level = (short)uVar26;
                state_00.el_info[10].flags = (char)((uint)uVar26 >> 0x10);
                state_00.el_info[10]._3_1_ = (char)((uint)uVar26 >> 0x18);
                state_00.el_info[0xb].res_level = (short)uVar27;
                state_00.el_info[0xb].flags = (char)((uint)uVar27 >> 0x10);
                state_00.el_info[0xb]._3_1_ = (char)((uint)uVar27 >> 0x18);
                state_00.el_info[0xc].res_level = (short)uVar28;
                state_00.el_info[0xc].flags = (char)((uint)uVar28 >> 0x10);
                state_00.el_info[0xc]._3_1_ = (char)((uint)uVar28 >> 0x18);
                state_00.el_info[0xd].res_level = (short)uVar29;
                state_00.el_info[0xd].flags = (char)((uint)uVar29 >> 0x10);
                state_00.el_info[0xd]._3_1_ = (char)((uint)uVar29 >> 0x18);
                state_00.el_info[0xe].res_level = (short)uVar30;
                state_00.el_info[0xe].flags = (char)((uint)uVar30 >> 0x10);
                state_00.el_info[0xe]._3_1_ = (char)((uint)uVar30 >> 0x18);
                state_00.el_info[0xf].res_level = (short)uVar31;
                state_00.el_info[0xf].flags = (char)((uint)uVar31 >> 0x10);
                state_00.el_info[0xf]._3_1_ = (char)((uint)uVar31 >> 0x18);
                state_00.el_info[0x10].res_level = (short)uVar32;
                state_00.el_info[0x10].flags = (char)((uint)uVar32 >> 0x10);
                state_00.el_info[0x10]._3_1_ = (char)((uint)uVar32 >> 0x18);
                state_00.el_info[0x11].res_level = (short)uVar33;
                state_00.el_info[0x11].flags = (char)((uint)uVar33 >> 0x10);
                state_00.el_info[0x11]._3_1_ = (char)((uint)uVar33 >> 0x18);
                state_00.el_info[0x12].res_level = (short)uVar34;
                state_00.el_info[0x12].flags = (char)((uint)uVar34 >> 0x10);
                state_00.el_info[0x12]._3_1_ = (char)((uint)uVar34 >> 0x18);
                state_00.el_info[0x13].res_level = (short)uVar35;
                state_00.el_info[0x13].flags = (char)((uint)uVar35 >> 0x10);
                state_00.el_info[0x13]._3_1_ = (char)((uint)uVar35 >> 0x18);
                state_00.el_info[0x14].res_level = (short)uVar36;
                state_00.el_info[0x14].flags = (char)((uint)uVar36 >> 0x10);
                state_00.el_info[0x14]._3_1_ = (char)((uint)uVar36 >> 0x18);
                state_00.el_info[0x15].res_level = (short)uVar37;
                state_00.el_info[0x15].flags = (char)((uint)uVar37 >> 0x10);
                state_00.el_info[0x15]._3_1_ = (char)((uint)uVar37 >> 0x18);
                state_00.el_info[0x16].res_level = (short)uVar38;
                state_00.el_info[0x16].flags = (char)((uint)uVar38 >> 0x10);
                state_00.el_info[0x16]._3_1_ = (char)((uint)uVar38 >> 0x18);
                state_00.el_info[0x17].res_level = (short)uVar39;
                state_00.el_info[0x17].flags = (char)((uint)uVar39 >> 0x10);
                state_00.el_info[0x17]._3_1_ = (char)((uint)uVar39 >> 0x18);
                state_00.el_info[0x18].res_level = (short)uVar40;
                state_00.el_info[0x18].flags = (char)((uint)uVar40 >> 0x10);
                state_00.el_info[0x18]._3_1_ = (char)((uint)uVar40 >> 0x18);
                state_00.el_info[0x19].res_level = (short)uVar41;
                state_00.el_info[0x19].flags = (char)((uint)uVar41 >> 0x10);
                state_00.el_info[0x19]._3_1_ = (char)((uint)uVar41 >> 0x18);
                state_00.el_info[0x1a].res_level = (short)uVar42;
                state_00.el_info[0x1a].flags = (char)((uint)uVar42 >> 0x10);
                state_00.el_info[0x1a]._3_1_ = (char)((uint)uVar42 >> 0x18);
                state_00.el_info[0x1b].res_level = in_stack_fffffffffffffd38._310_2_;
                _Var2 = player_resists_effects(state_00,L'\t');
                if (_Var2) goto LAB_0017a16b;
                if (L'c' < (p->known_state).skills[3]) goto LAB_0017a012;
              }
            }
            else {
              flags = (p->known_state).flags;
              _Var2 = flag_has_dbg(flags,6,9,"p->known_state.flags","OF_PROT_STUN");
              if (!_Var2) goto LAB_0017a1bb;
              _Var2 = flag_has_dbg(flags,6,8,"p->known_state.flags","OF_PROT_CONF");
              if ((_Var2) || (peVar12->subtype != L'\r')) goto LAB_0017a012;
            }
          }
        }
        else {
          if (L'c' < (p->known_state).skills[3]) {
            attr = pmVar9->lore_attr_resist;
            if (pmVar9->lore_attr_immune != '\0') {
              attr = pmVar9->lore_attr_immune;
            }
            goto LAB_0017a204;
          }
          if (peVar12->index == 10) {
            _Var2 = player_inc_check(p,peVar12->subtype,true);
            if (!_Var2) goto LAB_0017a012;
          }
          else if (peVar12->index == 0x3d) {
            memcpy(local_170,&p->known_state,0x13c);
            puVar13 = local_170;
            puVar14 = (undefined8 *)&stack0xfffffffffffffd38;
            for (lVar11 = 0x27; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar14 = *puVar13;
              puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
            }
            state.el_info[0x1b].flags = (undefined1)local_38;
            state.el_info[0x1b]._3_1_ = local_38._1_1_;
            state._314_2_ = local_38._2_2_;
            uVar16 = in_stack_fffffffffffffd38._202_4_;
            uVar17 = in_stack_fffffffffffffd38._206_4_;
            uVar18 = in_stack_fffffffffffffd38._210_4_;
            uVar19 = in_stack_fffffffffffffd38._214_4_;
            uVar20 = in_stack_fffffffffffffd38._218_4_;
            uVar21 = in_stack_fffffffffffffd38._222_4_;
            uVar22 = in_stack_fffffffffffffd38._226_4_;
            uVar23 = in_stack_fffffffffffffd38._230_4_;
            uVar24 = in_stack_fffffffffffffd38._234_4_;
            uVar25 = in_stack_fffffffffffffd38._238_4_;
            uVar26 = in_stack_fffffffffffffd38._242_4_;
            uVar27 = in_stack_fffffffffffffd38._246_4_;
            uVar28 = in_stack_fffffffffffffd38._250_4_;
            uVar29 = in_stack_fffffffffffffd38._254_4_;
            uVar30 = in_stack_fffffffffffffd38._258_4_;
            uVar31 = in_stack_fffffffffffffd38._262_4_;
            uVar32 = in_stack_fffffffffffffd38._266_4_;
            uVar33 = in_stack_fffffffffffffd38._270_4_;
            uVar34 = in_stack_fffffffffffffd38._274_4_;
            uVar35 = in_stack_fffffffffffffd38._278_4_;
            uVar36 = in_stack_fffffffffffffd38._282_4_;
            uVar37 = in_stack_fffffffffffffd38._286_4_;
            uVar38 = in_stack_fffffffffffffd38._290_4_;
            uVar39 = in_stack_fffffffffffffd38._294_4_;
            uVar40 = in_stack_fffffffffffffd38._298_4_;
            uVar41 = in_stack_fffffffffffffd38._302_4_;
            uVar42 = in_stack_fffffffffffffd38._306_4_;
            state.stat_add[0] = in_stack_fffffffffffffd38._0_4_;
            state.stat_add[1] = in_stack_fffffffffffffd38._4_4_;
            state.stat_add[2] = in_stack_fffffffffffffd38._8_4_;
            state.stat_add[3] = in_stack_fffffffffffffd38._12_4_;
            state.stat_add[4] = in_stack_fffffffffffffd38._16_4_;
            state.stat_ind[0] = in_stack_fffffffffffffd38._20_4_;
            state.stat_ind[1] = in_stack_fffffffffffffd38._24_4_;
            state.stat_ind[2] = in_stack_fffffffffffffd38._28_4_;
            state.stat_ind[3] = in_stack_fffffffffffffd38._32_4_;
            state.stat_ind[4] = in_stack_fffffffffffffd38._36_4_;
            state.stat_use[0] = in_stack_fffffffffffffd38._40_4_;
            state.stat_use[1] = in_stack_fffffffffffffd38._44_4_;
            state.stat_use[2] = in_stack_fffffffffffffd38._48_4_;
            state.stat_use[3] = in_stack_fffffffffffffd38._52_4_;
            state.stat_use[4] = in_stack_fffffffffffffd38._56_4_;
            state.stat_top[0] = in_stack_fffffffffffffd38._60_4_;
            state.stat_top[1] = in_stack_fffffffffffffd38._64_4_;
            state.stat_top[2] = in_stack_fffffffffffffd38._68_4_;
            state.stat_top[3] = in_stack_fffffffffffffd38._72_4_;
            state.stat_top[4] = in_stack_fffffffffffffd38._76_4_;
            state.skills[0] = in_stack_fffffffffffffd38._80_4_;
            state.skills[1] = in_stack_fffffffffffffd38._84_4_;
            state.skills[2] = in_stack_fffffffffffffd38._88_4_;
            state.skills[3] = in_stack_fffffffffffffd38._92_4_;
            state.skills[4] = in_stack_fffffffffffffd38._96_4_;
            state.skills[5] = in_stack_fffffffffffffd38._100_4_;
            state.skills[6] = in_stack_fffffffffffffd38._104_4_;
            state.skills[7] = in_stack_fffffffffffffd38._108_4_;
            state.skills[8] = in_stack_fffffffffffffd38._112_4_;
            state.skills[9] = in_stack_fffffffffffffd38._116_4_;
            state.speed = in_stack_fffffffffffffd38._120_4_;
            state.num_blows = in_stack_fffffffffffffd38._124_4_;
            state.num_shots = in_stack_fffffffffffffd38._128_4_;
            state.num_moves = in_stack_fffffffffffffd38._132_4_;
            state.ammo_mult = in_stack_fffffffffffffd38._136_4_;
            state.ammo_tval = in_stack_fffffffffffffd38._140_4_;
            state.ac = in_stack_fffffffffffffd38._144_4_;
            state.dam_red = in_stack_fffffffffffffd38._148_4_;
            state.perc_dam_red = in_stack_fffffffffffffd38._152_4_;
            state.to_a = in_stack_fffffffffffffd38._156_4_;
            state.to_h = in_stack_fffffffffffffd38._160_4_;
            state.to_d = in_stack_fffffffffffffd38._164_4_;
            state.see_infra = in_stack_fffffffffffffd38._168_4_;
            state.cur_light = in_stack_fffffffffffffd38._172_4_;
            state.evasion_chance = in_stack_fffffffffffffd38._176_4_;
            state.shield_on_back = (_Bool)in_stack_fffffffffffffd38[0xb4];
            state.heavy_wield = (_Bool)in_stack_fffffffffffffd38[0xb5];
            state.heavy_shoot = (_Bool)in_stack_fffffffffffffd38[0xb6];
            state.bless_wield = (_Bool)in_stack_fffffffffffffd38[0xb7];
            state.cumber_armor = (_Bool)in_stack_fffffffffffffd38[0xb8];
            state.flags[0] = in_stack_fffffffffffffd38[0xb9];
            state.flags[1] = in_stack_fffffffffffffd38[0xba];
            state.flags[2] = in_stack_fffffffffffffd38[0xbb];
            state.flags[3] = in_stack_fffffffffffffd38[0xbc];
            state.flags[4] = in_stack_fffffffffffffd38[0xbd];
            state.flags[5] = in_stack_fffffffffffffd38[0xbe];
            state.pflags[0] = in_stack_fffffffffffffd38[0xbf];
            state.pflags[1] = in_stack_fffffffffffffd38[0xc0];
            state.pflags[2] = in_stack_fffffffffffffd38[0xc1];
            state.pflags[3] = in_stack_fffffffffffffd38[0xc2];
            state.pflags[4] = in_stack_fffffffffffffd38[0xc3];
            state.pflags[5] = in_stack_fffffffffffffd38[0xc4];
            state.pflags[6] = in_stack_fffffffffffffd38[0xc5];
            state.pflags[7] = in_stack_fffffffffffffd38[0xc6];
            state.pflags[8] = in_stack_fffffffffffffd38[199];
            state.pflags[9] = in_stack_fffffffffffffd38[200];
            state._201_1_ = in_stack_fffffffffffffd38[0xc9];
            state.el_info[0].res_level = (short)uVar16;
            state.el_info[0].flags = (char)((uint)uVar16 >> 0x10);
            state.el_info[0]._3_1_ = (char)((uint)uVar16 >> 0x18);
            state.el_info[1].res_level = (short)uVar17;
            state.el_info[1].flags = (char)((uint)uVar17 >> 0x10);
            state.el_info[1]._3_1_ = (char)((uint)uVar17 >> 0x18);
            state.el_info[2].res_level = (short)uVar18;
            state.el_info[2].flags = (char)((uint)uVar18 >> 0x10);
            state.el_info[2]._3_1_ = (char)((uint)uVar18 >> 0x18);
            state.el_info[3].res_level = (short)uVar19;
            state.el_info[3].flags = (char)((uint)uVar19 >> 0x10);
            state.el_info[3]._3_1_ = (char)((uint)uVar19 >> 0x18);
            state.el_info[4].res_level = (short)uVar20;
            state.el_info[4].flags = (char)((uint)uVar20 >> 0x10);
            state.el_info[4]._3_1_ = (char)((uint)uVar20 >> 0x18);
            state.el_info[5].res_level = (short)uVar21;
            state.el_info[5].flags = (char)((uint)uVar21 >> 0x10);
            state.el_info[5]._3_1_ = (char)((uint)uVar21 >> 0x18);
            state.el_info[6].res_level = (short)uVar22;
            state.el_info[6].flags = (char)((uint)uVar22 >> 0x10);
            state.el_info[6]._3_1_ = (char)((uint)uVar22 >> 0x18);
            state.el_info[7].res_level = (short)uVar23;
            state.el_info[7].flags = (char)((uint)uVar23 >> 0x10);
            state.el_info[7]._3_1_ = (char)((uint)uVar23 >> 0x18);
            state.el_info[8].res_level = (short)uVar24;
            state.el_info[8].flags = (char)((uint)uVar24 >> 0x10);
            state.el_info[8]._3_1_ = (char)((uint)uVar24 >> 0x18);
            state.el_info[9].res_level = (short)uVar25;
            state.el_info[9].flags = (char)((uint)uVar25 >> 0x10);
            state.el_info[9]._3_1_ = (char)((uint)uVar25 >> 0x18);
            state.el_info[10].res_level = (short)uVar26;
            state.el_info[10].flags = (char)((uint)uVar26 >> 0x10);
            state.el_info[10]._3_1_ = (char)((uint)uVar26 >> 0x18);
            state.el_info[0xb].res_level = (short)uVar27;
            state.el_info[0xb].flags = (char)((uint)uVar27 >> 0x10);
            state.el_info[0xb]._3_1_ = (char)((uint)uVar27 >> 0x18);
            state.el_info[0xc].res_level = (short)uVar28;
            state.el_info[0xc].flags = (char)((uint)uVar28 >> 0x10);
            state.el_info[0xc]._3_1_ = (char)((uint)uVar28 >> 0x18);
            state.el_info[0xd].res_level = (short)uVar29;
            state.el_info[0xd].flags = (char)((uint)uVar29 >> 0x10);
            state.el_info[0xd]._3_1_ = (char)((uint)uVar29 >> 0x18);
            state.el_info[0xe].res_level = (short)uVar30;
            state.el_info[0xe].flags = (char)((uint)uVar30 >> 0x10);
            state.el_info[0xe]._3_1_ = (char)((uint)uVar30 >> 0x18);
            state.el_info[0xf].res_level = (short)uVar31;
            state.el_info[0xf].flags = (char)((uint)uVar31 >> 0x10);
            state.el_info[0xf]._3_1_ = (char)((uint)uVar31 >> 0x18);
            state.el_info[0x10].res_level = (short)uVar32;
            state.el_info[0x10].flags = (char)((uint)uVar32 >> 0x10);
            state.el_info[0x10]._3_1_ = (char)((uint)uVar32 >> 0x18);
            state.el_info[0x11].res_level = (short)uVar33;
            state.el_info[0x11].flags = (char)((uint)uVar33 >> 0x10);
            state.el_info[0x11]._3_1_ = (char)((uint)uVar33 >> 0x18);
            state.el_info[0x12].res_level = (short)uVar34;
            state.el_info[0x12].flags = (char)((uint)uVar34 >> 0x10);
            state.el_info[0x12]._3_1_ = (char)((uint)uVar34 >> 0x18);
            state.el_info[0x13].res_level = (short)uVar35;
            state.el_info[0x13].flags = (char)((uint)uVar35 >> 0x10);
            state.el_info[0x13]._3_1_ = (char)((uint)uVar35 >> 0x18);
            state.el_info[0x14].res_level = (short)uVar36;
            state.el_info[0x14].flags = (char)((uint)uVar36 >> 0x10);
            state.el_info[0x14]._3_1_ = (char)((uint)uVar36 >> 0x18);
            state.el_info[0x15].res_level = (short)uVar37;
            state.el_info[0x15].flags = (char)((uint)uVar37 >> 0x10);
            state.el_info[0x15]._3_1_ = (char)((uint)uVar37 >> 0x18);
            state.el_info[0x16].res_level = (short)uVar38;
            state.el_info[0x16].flags = (char)((uint)uVar38 >> 0x10);
            state.el_info[0x16]._3_1_ = (char)((uint)uVar38 >> 0x18);
            state.el_info[0x17].res_level = (short)uVar39;
            state.el_info[0x17].flags = (char)((uint)uVar39 >> 0x10);
            state.el_info[0x17]._3_1_ = (char)((uint)uVar39 >> 0x18);
            state.el_info[0x18].res_level = (short)uVar40;
            state.el_info[0x18].flags = (char)((uint)uVar40 >> 0x10);
            state.el_info[0x18]._3_1_ = (char)((uint)uVar40 >> 0x18);
            state.el_info[0x19].res_level = (short)uVar41;
            state.el_info[0x19].flags = (char)((uint)uVar41 >> 0x10);
            state.el_info[0x19]._3_1_ = (char)((uint)uVar41 >> 0x18);
            state.el_info[0x1a].res_level = (short)uVar42;
            state.el_info[0x1a].flags = (char)((uint)uVar42 >> 0x10);
            state.el_info[0x1a]._3_1_ = (char)((uint)uVar42 >> 0x18);
            state.el_info[0x1b].res_level = in_stack_fffffffffffffd38._310_2_;
            _Var2 = player_resists_effects(state,L'\t');
            if (_Var2) {
LAB_0017a012:
              attr = pmVar9->lore_attr_resist;
              goto LAB_0017a204;
            }
          }
          else if (pmVar9->lore_attr_immune != '\0') {
            for (; peVar12 != (effect *)0x0; peVar12 = peVar12->next) {
              if ((peVar12->index == 10) &&
                 (_Var2 = player_inc_check(p,peVar12->subtype,true), _Var2)) goto LAB_0017a200;
            }
            goto LAB_0017a012;
          }
        }
      }
LAB_0017a200:
      attr = pmVar9->lore_attr;
    }
LAB_0017a204:
    wVar5 = mon_spell_lore_damage(index,race,know_hp);
    wVar6 = flag_next(f,0xd,1);
    if (index != wVar6) {
      if (2 < iVar3) {
        textblock_append(tb,",");
      }
      iVar7 = flag_next(f,0xd,index + L'\x01');
      if (iVar7 == 0) {
        textblock_append(tb," ");
        textblock_append(tb,"%s","or");
      }
      textblock_append(tb," ");
    }
    pcVar10 = mon_spell_lore_description(index,race);
    textblock_append_c(tb,attr,"%s",pcVar10);
    if (L'\0' < wVar5) {
      textblock_append_c(tb,attr," (%d)",(ulong)(uint)wVar5);
    }
    index = flag_next(f,0xd,index + L'\x01');
    p = player;
  } while( true );
}

Assistant:

static void lore_append_spell_clause(textblock *tb, bitflag *f, bool know_hp,
									 const struct monster_race *race,
									 const char *conjunction,
									 const char *end)
{
	int count = rsf_count(f);
	bool comma = count > 2;

	if (count) {
		int spell;
		for (spell = rsf_next(f, FLAG_START); spell;
			 spell = rsf_next(f, spell + 1)) {
			int color = spell_color(player, race, spell);
			int damage = mon_spell_lore_damage(spell, race, know_hp);

			/* First entry starts immediately */
			if (spell != rsf_next(f, FLAG_START)) {
				if (comma) {
					textblock_append(tb, ",");
				}
				/* Last entry */
				if (rsf_next(f, spell + 1) == FLAG_END) {
					textblock_append(tb, " ");
					textblock_append(tb, "%s", conjunction);
				}
				textblock_append(tb, " ");
			}
			textblock_append_c(tb, color, "%s",
							   mon_spell_lore_description(spell, race));
			if (damage > 0) {
				textblock_append_c(tb, color, " (%d)", damage);
			}
		}
		textblock_append(tb, "%s", end);
	}
}